

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::genFindUpperBound
          (string *__return_storage_ptr__,CppGenerator *this,string *rel_name,string *attrName,
          size_t depth,bool parallel)

{
  undefined8 *puVar1;
  bool bVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_t sVar6;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  CppGenerator *this_00;
  ulong uVar14;
  string depthString;
  string *returnString;
  string upperPointer;
  char *local_fa0;
  uint local_f98;
  char local_f90 [16];
  ulong *local_f80;
  long local_f78;
  ulong local_f70;
  long lStack_f68;
  ulong *local_f60;
  long local_f58;
  ulong local_f50;
  long lStack_f48;
  ulong *local_f40;
  long local_f38;
  ulong local_f30;
  long lStack_f28;
  ulong *local_f20;
  long local_f18;
  ulong local_f10;
  long lStack_f08;
  ulong *local_f00;
  long local_ef8;
  ulong local_ef0;
  long lStack_ee8;
  ulong *local_ee0;
  long local_ed8;
  ulong local_ed0;
  undefined8 uStack_ec8;
  ulong *local_ec0;
  long local_eb8;
  ulong local_eb0;
  undefined8 uStack_ea8;
  ulong *local_ea0;
  long local_e98;
  ulong local_e90;
  undefined8 uStack_e88;
  ulong *local_e80;
  long local_e78;
  ulong local_e70;
  long lStack_e68;
  ulong *local_e60;
  long local_e58;
  ulong local_e50;
  long lStack_e48;
  ulong *local_e40;
  long local_e38;
  ulong local_e30;
  long lStack_e28;
  ulong *local_e20;
  long local_e18;
  ulong local_e10;
  long lStack_e08;
  ulong *local_e00;
  long local_df8;
  ulong local_df0;
  long lStack_de8;
  ulong *local_de0;
  long local_dd8;
  ulong local_dd0;
  long lStack_dc8;
  string *local_dc0;
  ulong *local_db8;
  long local_db0;
  ulong local_da8;
  long lStack_da0;
  ulong *local_d98;
  long local_d90;
  ulong local_d88;
  long lStack_d80;
  ulong *local_d78;
  long local_d70;
  ulong local_d68;
  long lStack_d60;
  ulong *local_d58;
  long local_d50;
  ulong local_d48;
  long lStack_d40;
  ulong *local_d38;
  long local_d30;
  ulong local_d28;
  long lStack_d20;
  long *local_d18;
  long local_d10;
  long local_d08;
  long lStack_d00;
  long *local_cf8;
  long local_cf0;
  long local_ce8;
  long lStack_ce0;
  long *local_cd8;
  long local_cd0;
  long local_cc8;
  long lStack_cc0;
  long *local_cb8;
  long local_cb0;
  long local_ca8;
  long lStack_ca0;
  long *local_c98;
  long local_c90;
  long local_c88;
  long lStack_c80;
  long *local_c78;
  long local_c70;
  long local_c68;
  long lStack_c60;
  long *local_c58;
  long local_c50;
  long local_c48;
  long lStack_c40;
  long *local_c38;
  long local_c30;
  long local_c28;
  long lStack_c20;
  long *local_c18;
  long local_c10;
  long local_c08;
  long lStack_c00;
  long *local_bf8;
  long local_bf0;
  long local_be8;
  long lStack_be0;
  ulong *local_bd8;
  long local_bd0;
  ulong local_bc8;
  long lStack_bc0;
  ulong *local_bb8;
  long local_bb0;
  ulong local_ba8;
  long lStack_ba0;
  ulong *local_b98;
  long local_b90;
  ulong local_b88;
  long lStack_b80;
  ulong *local_b78;
  long local_b70;
  ulong local_b68;
  long lStack_b60;
  ulong *local_b58;
  long local_b50;
  ulong local_b48;
  long lStack_b40;
  ulong *local_b38;
  long local_b30;
  ulong local_b28;
  long lStack_b20;
  ulong *local_b18;
  long local_b10;
  ulong local_b08;
  long lStack_b00;
  ulong *local_af8;
  long local_af0;
  ulong local_ae8;
  long lStack_ae0;
  ulong *local_ad8;
  long local_ad0;
  ulong local_ac8;
  long lStack_ac0;
  ulong *local_ab8;
  long local_ab0;
  ulong local_aa8;
  long lStack_aa0;
  ulong *local_a98;
  long local_a90;
  ulong local_a88;
  long lStack_a80;
  ulong *local_a78;
  long local_a70;
  ulong local_a68;
  long lStack_a60;
  ulong *local_a58;
  long local_a50;
  ulong local_a48;
  long lStack_a40;
  long *local_a38;
  long local_a30;
  long local_a28;
  long lStack_a20;
  long *local_a18;
  long local_a10;
  long local_a08;
  long lStack_a00;
  ulong *local_9f8;
  long local_9f0;
  ulong local_9e8;
  long lStack_9e0;
  ulong *local_9d8;
  long local_9d0;
  ulong local_9c8;
  long lStack_9c0;
  ulong *local_9b8;
  long local_9b0;
  ulong local_9a8;
  long lStack_9a0;
  long *local_998;
  long local_990;
  long local_988;
  long lStack_980;
  ulong *local_978;
  long local_970;
  ulong local_968;
  long lStack_960;
  ulong *local_958;
  long local_950;
  ulong local_948;
  long lStack_940;
  ulong *local_938;
  long local_930;
  ulong local_928;
  long lStack_920;
  ulong *local_918;
  long local_910;
  ulong local_908;
  long lStack_900;
  ulong *local_8f8;
  long local_8f0;
  ulong local_8e8;
  long lStack_8e0;
  ulong *local_8d8;
  long local_8d0;
  ulong local_8c8;
  long lStack_8c0;
  ulong *local_8b8;
  long local_8b0;
  ulong local_8a8;
  long lStack_8a0;
  ulong *local_898;
  long local_890;
  ulong local_888;
  long lStack_880;
  ulong *local_878;
  long local_870;
  ulong local_868;
  long lStack_860;
  ulong *local_858;
  long local_850;
  ulong local_848;
  long lStack_840;
  ulong *local_838;
  long local_830;
  ulong local_828;
  long lStack_820;
  ulong *local_818;
  long local_810;
  ulong local_808;
  long lStack_800;
  long *local_7f8;
  long local_7f0;
  long local_7e8;
  long lStack_7e0;
  long *local_7d8;
  long local_7d0;
  long local_7c8;
  long lStack_7c0;
  long *local_7b8;
  long local_7b0;
  long local_7a8;
  long lStack_7a0;
  long *local_798;
  long local_790;
  long local_788;
  long lStack_780;
  long *local_778;
  long local_770;
  long local_768;
  long lStack_760;
  long *local_758;
  long local_750;
  long local_748;
  long lStack_740;
  long *local_738;
  long local_730;
  long local_728;
  long lStack_720;
  long *local_718;
  long local_710;
  long local_708;
  long lStack_700;
  long *local_6f8;
  long local_6f0;
  long local_6e8;
  long lStack_6e0;
  ulong *local_6d8;
  long local_6d0;
  ulong local_6c8;
  long lStack_6c0;
  long *local_6b8;
  long local_6b0;
  long local_6a8;
  long lStack_6a0;
  long *local_698;
  long local_690;
  long local_688;
  long lStack_680;
  long *local_678;
  long local_670;
  long local_668;
  long lStack_660;
  long *local_658;
  long local_650;
  long local_648;
  long lStack_640;
  long *local_638;
  long local_630;
  long local_628;
  long lStack_620;
  long *local_618;
  long local_610;
  long local_608;
  long lStack_600;
  long *local_5f8;
  long local_5f0;
  long local_5e8;
  long lStack_5e0;
  long *local_5d8;
  long local_5d0;
  long local_5c8;
  long lStack_5c0;
  long *local_5b8;
  long local_5b0;
  long local_5a8;
  long lStack_5a0;
  long *local_598;
  long local_590;
  long local_588;
  long lStack_580;
  long *local_578;
  long local_570;
  long local_568;
  long lStack_560;
  long *local_558;
  long local_550;
  long local_548;
  long lStack_540;
  long *local_538;
  long local_530;
  long local_528;
  long lStack_520;
  long *local_518;
  long local_510;
  long local_508;
  long lStack_500;
  long *local_4f8;
  long local_4f0;
  long local_4e8;
  long lStack_4e0;
  long *local_4d8;
  long local_4d0;
  long local_4c8;
  long lStack_4c0;
  long *local_4b8;
  long local_4b0;
  long local_4a8;
  long lStack_4a0;
  long *local_498;
  long local_490;
  long local_488;
  long lStack_480;
  long *local_478;
  long local_470;
  long local_468;
  long lStack_460;
  long *local_458;
  long local_450;
  long local_448;
  long lStack_440;
  long *local_438;
  long local_430;
  long local_428;
  long lStack_420;
  long *local_418;
  long local_410;
  long local_408;
  long lStack_400;
  long *local_3f8;
  long local_3f0;
  long local_3e8;
  long lStack_3e0;
  ulong *local_3d8;
  long local_3d0;
  ulong local_3c8;
  long lStack_3c0;
  ulong *local_3b8;
  long local_3b0;
  ulong local_3a8 [2];
  ulong *local_398;
  long local_390;
  ulong local_388 [2];
  ulong *local_378;
  long local_370;
  ulong local_368 [2];
  ulong *local_358;
  long local_350;
  ulong local_348 [2];
  ulong *local_338;
  long local_330;
  ulong local_328 [2];
  ulong *local_318;
  long local_310;
  ulong local_308 [2];
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8 [2];
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8 [2];
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8 [2];
  ulong *local_298;
  long local_290;
  ulong local_288 [2];
  ulong *local_278;
  long local_270;
  ulong local_268 [2];
  ulong *local_258;
  long local_250;
  ulong local_248 [2];
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8 [2];
  ulong *local_198;
  long local_190;
  ulong local_188 [2];
  undefined8 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  string local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  cVar10 = '\x01';
  if (9 < depth) {
    sVar6 = depth;
    cVar13 = '\x04';
    do {
      cVar10 = cVar13;
      if (sVar6 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_002843eb;
      }
      if (sVar6 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_002843eb;
      }
      if (sVar6 < 10000) goto LAB_002843eb;
      bVar2 = 99999 < sVar6;
      sVar6 = sVar6 / 10000;
      cVar13 = cVar10 + '\x04';
    } while (bVar2);
    cVar10 = cVar10 + '\x01';
  }
LAB_002843eb:
  local_fa0 = local_f90;
  local_dc0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)&local_fa0,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_fa0,local_f98,depth);
  this_00 = (CppGenerator *)(rel_name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,this_00,
             (pointer)((long)&(this_00->super_CodeGenerator)._vptr_CodeGenerator +
                      rel_name->_M_string_length));
  getUpperPointer(&local_158,this_00,&local_50,depth,parallel);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  cVar10 = (char)depth * '\x03' + '\x12';
  local_3f8 = &local_3e8;
  std::__cxx11::string::_M_construct((ulong)&local_3f8,cVar10);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_3f8);
  local_6b8 = &local_6a8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_6a8 = *plVar7;
    lStack_6a0 = plVar4[3];
  }
  else {
    local_6a8 = *plVar7;
    local_6b8 = (long *)*plVar4;
  }
  local_6b0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_6b8,(ulong)(attrName->_M_dataplus)._M_p);
  local_698 = &local_688;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_688 = *plVar7;
    lStack_680 = plVar4[3];
  }
  else {
    local_688 = *plVar7;
    local_698 = (long *)*plVar4;
  }
  local_690 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_698);
  local_678 = &local_668;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_668 = *plVar7;
    lStack_660 = plVar4[3];
  }
  else {
    local_668 = *plVar7;
    local_678 = (long *)*plVar4;
  }
  local_670 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_678,(ulong)(rel_name->_M_dataplus)._M_p);
  local_658 = &local_648;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_648 = *plVar7;
    lStack_640 = plVar4[3];
  }
  else {
    local_648 = *plVar7;
    local_658 = (long *)*plVar4;
  }
  local_650 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_658);
  local_638 = &local_628;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_628 = *plVar7;
    lStack_620 = plVar4[3];
  }
  else {
    local_628 = *plVar7;
    local_638 = (long *)*plVar4;
  }
  local_630 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_638,(ulong)(rel_name->_M_dataplus)._M_p);
  local_618 = &local_608;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_608 = *plVar7;
    lStack_600 = plVar4[3];
  }
  else {
    local_608 = *plVar7;
    local_618 = (long *)*plVar4;
  }
  local_610 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_618);
  local_5f8 = &local_5e8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_5e8 = *plVar7;
    lStack_5e0 = plVar4[3];
  }
  else {
    local_5e8 = *plVar7;
    local_5f8 = (long *)*plVar4;
  }
  local_5f0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_fa0);
  local_bd8 = &local_bc8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_bc8 = *puVar8;
    lStack_bc0 = plVar4[3];
  }
  else {
    local_bc8 = *puVar8;
    local_bd8 = (ulong *)*plVar4;
  }
  local_bd0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_bd8);
  local_d18 = &local_d08;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_d08 = *plVar7;
    lStack_d00 = plVar4[3];
  }
  else {
    local_d08 = *plVar7;
    local_d18 = (long *)*plVar4;
  }
  local_d10 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d18,(ulong)(attrName->_M_dataplus)._M_p);
  local_bb8 = &local_ba8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_ba8 = *puVar8;
    lStack_ba0 = plVar4[3];
  }
  else {
    local_ba8 = *puVar8;
    local_bb8 = (ulong *)*plVar4;
  }
  local_bb0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_bb8);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_f30 = *puVar8;
    lStack_f28 = plVar4[3];
    local_f40 = &local_f30;
  }
  else {
    local_f30 = *puVar8;
    local_f40 = (ulong *)*plVar4;
  }
  local_f38 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_6d8 = &local_6c8;
  std::__cxx11::string::_M_construct((ulong)&local_6d8,cVar10);
  uVar14 = 0xf;
  if (local_f40 != &local_f30) {
    uVar14 = local_f30;
  }
  if (uVar14 < (ulong)(local_6d0 + local_f38)) {
    uVar14 = 0xf;
    if (local_6d8 != &local_6c8) {
      uVar14 = local_6c8;
    }
    if (uVar14 < (ulong)(local_6d0 + local_f38)) goto LAB_00284923;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,(ulong)local_f40);
  }
  else {
LAB_00284923:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f40,(ulong)local_6d8);
  }
  local_e80 = &local_e70;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_e70 = *puVar8;
    lStack_e68 = puVar5[3];
  }
  else {
    local_e70 = *puVar8;
    local_e80 = (ulong *)*puVar5;
  }
  local_e78 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e80);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_f10 = *puVar8;
    lStack_f08 = plVar4[3];
    local_f20 = &local_f10;
  }
  else {
    local_f10 = *puVar8;
    local_f20 = (ulong *)*plVar4;
  }
  local_f18 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_ea0 = &local_e90;
  std::__cxx11::string::_M_construct((ulong)&local_ea0,cVar10);
  uVar14 = 0xf;
  if (local_f20 != &local_f10) {
    uVar14 = local_f10;
  }
  if (uVar14 < (ulong)(local_e98 + local_f18)) {
    uVar14 = 0xf;
    if (local_ea0 != &local_e90) {
      uVar14 = local_e90;
    }
    if (uVar14 < (ulong)(local_e98 + local_f18)) goto LAB_00284a6c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_ea0,0,(char *)0x0,(ulong)local_f20);
  }
  else {
LAB_00284a6c:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f20,(ulong)local_ea0);
  }
  local_e60 = &local_e50;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_e50 = *puVar8;
    lStack_e48 = puVar5[3];
  }
  else {
    local_e50 = *puVar8;
    local_e60 = (ulong *)*puVar5;
  }
  local_e58 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e60);
  local_cf8 = &local_ce8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_ce8 = *plVar7;
    lStack_ce0 = plVar4[3];
  }
  else {
    local_ce8 = *plVar7;
    local_cf8 = (long *)*plVar4;
  }
  local_cf0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_cf8,(ulong)(attrName->_M_dataplus)._M_p);
  local_5d8 = &local_5c8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_5c8 = *plVar7;
    lStack_5c0 = plVar4[3];
  }
  else {
    local_5c8 = *plVar7;
    local_5d8 = (long *)*plVar4;
  }
  local_5d0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_5d8);
  local_5b8 = &local_5a8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_5a8 = *plVar7;
    lStack_5a0 = plVar4[3];
  }
  else {
    local_5a8 = *plVar7;
    local_5b8 = (long *)*plVar4;
  }
  local_5b0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_5b8,(ulong)(attrName->_M_dataplus)._M_p);
  local_598 = &local_588;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_588 = *plVar7;
    lStack_580 = plVar4[3];
  }
  else {
    local_588 = *plVar7;
    local_598 = (long *)*plVar4;
  }
  local_590 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_598);
  local_578 = &local_568;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_568 = *plVar7;
    lStack_560 = plVar4[3];
  }
  else {
    local_568 = *plVar7;
    local_578 = (long *)*plVar4;
  }
  local_570 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_578);
  local_558 = &local_548;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_548 = *plVar7;
    lStack_540 = plVar4[3];
  }
  else {
    local_548 = *plVar7;
    local_558 = (long *)*plVar4;
  }
  local_550 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_558,(ulong)(rel_name->_M_dataplus)._M_p);
  local_538 = &local_528;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_528 = *plVar7;
    lStack_520 = plVar4[3];
  }
  else {
    local_528 = *plVar7;
    local_538 = (long *)*plVar4;
  }
  local_530 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_538);
  local_518 = &local_508;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_508 = *plVar7;
    lStack_500 = plVar4[3];
  }
  else {
    local_508 = *plVar7;
    local_518 = (long *)*plVar4;
  }
  local_510 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_fa0);
  local_4f8 = &local_4e8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_4e8 = *plVar7;
    lStack_4e0 = plVar4[3];
  }
  else {
    local_4e8 = *plVar7;
    local_4f8 = (long *)*plVar4;
  }
  local_4f0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_4f8);
  local_4d8 = &local_4c8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_4c8 = *plVar7;
    lStack_4c0 = plVar4[3];
  }
  else {
    local_4c8 = *plVar7;
    local_4d8 = (long *)*plVar4;
  }
  local_4d0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_4d8,(ulong)local_158._M_dataplus._M_p);
  local_4b8 = &local_4a8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_4a8 = *plVar7;
    lStack_4a0 = plVar4[3];
  }
  else {
    local_4a8 = *plVar7;
    local_4b8 = (long *)*plVar4;
  }
  local_4b0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_4b8);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_928 = *puVar8;
    lStack_920 = plVar4[3];
    local_938 = &local_928;
  }
  else {
    local_928 = *puVar8;
    local_938 = (ulong *)*plVar4;
  }
  local_930 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_d78 = &local_d68;
  std::__cxx11::string::_M_construct((ulong)&local_d78,cVar10);
  uVar14 = 0xf;
  if (local_938 != &local_928) {
    uVar14 = local_928;
  }
  if (uVar14 < (ulong)(local_d70 + local_930)) {
    uVar14 = 0xf;
    if (local_d78 != &local_d68) {
      uVar14 = local_d68;
    }
    if (uVar14 < (ulong)(local_d70 + local_930)) goto LAB_00284ff3;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d78,0,(char *)0x0,(ulong)local_938);
  }
  else {
LAB_00284ff3:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_938,(ulong)local_d78);
  }
  local_7f8 = &local_7e8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_7e8 = *plVar4;
    lStack_7e0 = puVar5[3];
  }
  else {
    local_7e8 = *plVar4;
    local_7f8 = (long *)*puVar5;
  }
  local_7f0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_7f8);
  cVar13 = (char)depth * '\x03';
  local_b98 = &local_b88;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_b88 = *puVar8;
    lStack_b80 = plVar4[3];
  }
  else {
    local_b88 = *puVar8;
    local_b98 = (ulong *)*plVar4;
  }
  local_b90 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  cVar11 = cVar13 + '\x15';
  local_ec0 = &local_eb0;
  std::__cxx11::string::_M_construct((ulong)&local_ec0,cVar11);
  uVar14 = 0xf;
  if (local_b98 != &local_b88) {
    uVar14 = local_b88;
  }
  if (uVar14 < (ulong)(local_eb8 + local_b90)) {
    uVar14 = 0xf;
    if (local_ec0 != &local_eb0) {
      uVar14 = local_eb0;
    }
    if (uVar14 < (ulong)(local_eb8 + local_b90)) goto LAB_0028514e;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_ec0,0,(char *)0x0,(ulong)local_b98);
  }
  else {
LAB_0028514e:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b98,(ulong)local_ec0);
  }
  local_e40 = &local_e30;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_e30 = *puVar8;
    lStack_e28 = puVar5[3];
  }
  else {
    local_e30 = *puVar8;
    local_e40 = (ulong *)*puVar5;
  }
  local_e38 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e40);
  local_cd8 = &local_cc8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_cc8 = *plVar7;
    lStack_cc0 = plVar4[3];
  }
  else {
    local_cc8 = *plVar7;
    local_cd8 = (long *)*plVar4;
  }
  local_cd0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_cd8,(ulong)(rel_name->_M_dataplus)._M_p);
  local_b78 = &local_b68;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_b68 = *puVar8;
    lStack_b60 = plVar4[3];
  }
  else {
    local_b68 = *puVar8;
    local_b78 = (ulong *)*plVar4;
  }
  local_b70 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b78);
  local_cb8 = &local_ca8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_ca8 = *plVar7;
    lStack_ca0 = plVar4[3];
  }
  else {
    local_ca8 = *plVar7;
    local_cb8 = (long *)*plVar4;
  }
  local_cb0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_cb8,(ulong)local_fa0);
  local_498 = &local_488;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_488 = *plVar7;
    lStack_480 = plVar4[3];
  }
  else {
    local_488 = *plVar7;
    local_498 = (long *)*plVar4;
  }
  local_490 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_498);
  local_b58 = &local_b48;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_b48 = *puVar8;
    lStack_b40 = plVar4[3];
  }
  else {
    local_b48 = *puVar8;
    local_b58 = (ulong *)*plVar4;
  }
  local_b50 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_d98 = &local_d88;
  std::__cxx11::string::_M_construct((ulong)&local_d98,cVar11);
  uVar14 = 0xf;
  if (local_b58 != &local_b48) {
    uVar14 = local_b48;
  }
  if (uVar14 < (ulong)(local_d90 + local_b50)) {
    uVar14 = 0xf;
    if (local_d98 != &local_d88) {
      uVar14 = local_d88;
    }
    if (uVar14 < (ulong)(local_d90 + local_b50)) goto LAB_00285428;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d98,0,(char *)0x0,(ulong)local_b58);
  }
  else {
LAB_00285428:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b58,(ulong)local_d98);
  }
  local_7d8 = &local_7c8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_7c8 = *plVar4;
    lStack_7c0 = puVar5[3];
  }
  else {
    local_7c8 = *plVar4;
    local_7d8 = (long *)*puVar5;
  }
  local_7d0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_7d8);
  local_b38 = &local_b28;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_b28 = *puVar8;
    lStack_b20 = plVar4[3];
  }
  else {
    local_b28 = *puVar8;
    local_b38 = (ulong *)*plVar4;
  }
  local_b30 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_ee0 = &local_ed0;
  std::__cxx11::string::_M_construct((ulong)&local_ee0,cVar11);
  uVar14 = 0xf;
  if (local_b38 != &local_b28) {
    uVar14 = local_b28;
  }
  if (uVar14 < (ulong)(local_ed8 + local_b30)) {
    uVar14 = 0xf;
    if (local_ee0 != &local_ed0) {
      uVar14 = local_ed0;
    }
    if (uVar14 < (ulong)(local_ed8 + local_b30)) goto LAB_0028557b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_ee0,0,(char *)0x0,(ulong)local_b38);
  }
  else {
LAB_0028557b:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b38,(ulong)local_ee0);
  }
  local_e20 = &local_e10;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_e10 = *puVar8;
    lStack_e08 = puVar5[3];
  }
  else {
    local_e10 = *puVar8;
    local_e20 = (ulong *)*puVar5;
  }
  local_e18 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e20);
  local_c98 = &local_c88;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_c88 = *plVar7;
    lStack_c80 = plVar4[3];
  }
  else {
    local_c88 = *plVar7;
    local_c98 = (long *)*plVar4;
  }
  local_c90 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c98,(ulong)(rel_name->_M_dataplus)._M_p);
  local_b18 = &local_b08;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_b08 = *puVar8;
    lStack_b00 = plVar4[3];
  }
  else {
    local_b08 = *puVar8;
    local_b18 = (ulong *)*plVar4;
  }
  local_b10 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b18);
  local_c78 = &local_c68;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_c68 = *plVar7;
    lStack_c60 = plVar4[3];
  }
  else {
    local_c68 = *plVar7;
    local_c78 = (long *)*plVar4;
  }
  local_c70 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_c78,(ulong)local_fa0);
  local_af8 = &local_ae8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_ae8 = *puVar8;
    lStack_ae0 = plVar4[3];
  }
  else {
    local_ae8 = *puVar8;
    local_af8 = (ulong *)*plVar4;
  }
  local_af0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_af8);
  local_c58 = &local_c48;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_c48 = *plVar7;
    lStack_c40 = plVar4[3];
  }
  else {
    local_c48 = *plVar7;
    local_c58 = (long *)*plVar4;
  }
  local_c50 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c58,(ulong)local_158._M_dataplus._M_p);
  local_478 = &local_468;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_468 = *plVar7;
    lStack_460 = plVar4[3];
  }
  else {
    local_468 = *plVar7;
    local_478 = (long *)*plVar4;
  }
  local_470 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_478);
  local_ad8 = &local_ac8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_ac8 = *puVar8;
    lStack_ac0 = plVar4[3];
  }
  else {
    local_ac8 = *puVar8;
    local_ad8 = (ulong *)*plVar4;
  }
  local_ad0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_db8 = &local_da8;
  std::__cxx11::string::_M_construct((ulong)&local_db8,cVar11);
  uVar14 = 0xf;
  if (local_ad8 != &local_ac8) {
    uVar14 = local_ac8;
  }
  if (uVar14 < (ulong)(local_db0 + local_ad0)) {
    uVar14 = 0xf;
    if (local_db8 != &local_da8) {
      uVar14 = local_da8;
    }
    if (uVar14 < (ulong)(local_db0 + local_ad0)) goto LAB_00285920;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_db8,0,(char *)0x0,(ulong)local_ad8);
  }
  else {
LAB_00285920:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ad8,(ulong)local_db8);
  }
  local_7b8 = &local_7a8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_7a8 = *plVar4;
    lStack_7a0 = puVar5[3];
  }
  else {
    local_7a8 = *plVar4;
    local_7b8 = (long *)*puVar5;
  }
  local_7b0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_7b8);
  local_ab8 = &local_aa8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_aa8 = *puVar8;
    lStack_aa0 = plVar4[3];
  }
  else {
    local_aa8 = *puVar8;
    local_ab8 = (ulong *)*plVar4;
  }
  local_ab0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  cVar12 = cVar13 + '\x18';
  local_818 = &local_808;
  std::__cxx11::string::_M_construct((ulong)&local_818,cVar12);
  uVar14 = 0xf;
  if (local_ab8 != &local_aa8) {
    uVar14 = local_aa8;
  }
  if (uVar14 < (ulong)(local_810 + local_ab0)) {
    uVar14 = 0xf;
    if (local_818 != &local_808) {
      uVar14 = local_808;
    }
    if (uVar14 < (ulong)(local_810 + local_ab0)) goto LAB_00285a7f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_818,0,(char *)0x0,(ulong)local_ab8);
  }
  else {
LAB_00285a7f:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ab8,(ulong)local_818);
  }
  local_798 = &local_788;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_788 = *plVar4;
    lStack_780 = puVar5[3];
  }
  else {
    local_788 = *plVar4;
    local_798 = (long *)*puVar5;
  }
  local_790 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_798);
  local_458 = &local_448;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_448 = *plVar7;
    lStack_440 = plVar4[3];
  }
  else {
    local_448 = *plVar7;
    local_458 = (long *)*plVar4;
  }
  local_450 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_458,(ulong)(attrName->_M_dataplus)._M_p);
  local_a98 = &local_a88;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_a88 = *puVar8;
    lStack_a80 = plVar4[3];
  }
  else {
    local_a88 = *puVar8;
    local_a98 = (ulong *)*plVar4;
  }
  local_a90 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a98);
  local_c38 = &local_c28;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_c28 = *plVar7;
    lStack_c20 = plVar4[3];
  }
  else {
    local_c28 = *plVar7;
    local_c38 = (long *)*plVar4;
  }
  local_c30 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c38,(ulong)(rel_name->_M_dataplus)._M_p);
  local_a78 = &local_a68;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_a68 = *puVar8;
    lStack_a60 = plVar4[3];
  }
  else {
    local_a68 = *puVar8;
    local_a78 = (ulong *)*plVar4;
  }
  local_a70 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a78);
  local_c18 = &local_c08;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_c08 = *plVar7;
    lStack_c00 = plVar4[3];
  }
  else {
    local_c08 = *plVar7;
    local_c18 = (long *)*plVar4;
  }
  local_c10 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c18,(ulong)(rel_name->_M_dataplus)._M_p);
  local_a58 = &local_a48;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_a48 = *puVar8;
    lStack_a40 = plVar4[3];
  }
  else {
    local_a48 = *puVar8;
    local_a58 = (ulong *)*plVar4;
  }
  local_a50 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a58);
  local_a38 = &local_a28;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_a28 = *plVar7;
    lStack_a20 = plVar4[3];
  }
  else {
    local_a28 = *plVar7;
    local_a38 = (long *)*plVar4;
  }
  local_a30 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_a38,(ulong)local_fa0);
  local_d58 = &local_d48;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_d48 = *puVar8;
    lStack_d40 = plVar4[3];
  }
  else {
    local_d48 = *puVar8;
    local_d58 = (ulong *)*plVar4;
  }
  local_d50 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d58);
  local_a18 = &local_a08;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_a08 = *plVar7;
    lStack_a00 = plVar4[3];
  }
  else {
    local_a08 = *plVar7;
    local_a18 = (long *)*plVar4;
  }
  local_a10 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a18,(ulong)(attrName->_M_dataplus)._M_p);
  local_d38 = &local_d28;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_d28 = *puVar8;
    lStack_d20 = plVar4[3];
  }
  else {
    local_d28 = *puVar8;
    local_d38 = (ulong *)*plVar4;
  }
  local_d30 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d38);
  local_f00 = &local_ef0;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_ef0 = *puVar8;
    lStack_ee8 = plVar4[3];
  }
  else {
    local_ef0 = *puVar8;
    local_f00 = (ulong *)*plVar4;
  }
  local_ef8 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_838 = &local_828;
  std::__cxx11::string::_M_construct((ulong)&local_838,cVar11);
  uVar14 = 0xf;
  if (local_f00 != &local_ef0) {
    uVar14 = local_ef0;
  }
  if (uVar14 < (ulong)(local_830 + local_ef8)) {
    uVar14 = 0xf;
    if (local_838 != &local_828) {
      uVar14 = local_828;
    }
    if (uVar14 < (ulong)(local_830 + local_ef8)) goto LAB_00285fab;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_838,0,(char *)0x0,(ulong)local_f00);
  }
  else {
LAB_00285fab:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f00,(ulong)local_838);
  }
  local_e00 = &local_df0;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_df0 = *puVar8;
    lStack_de8 = puVar5[3];
  }
  else {
    local_df0 = *puVar8;
    local_e00 = (ulong *)*puVar5;
  }
  local_df8 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e00);
  local_f80 = &local_f70;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_f70 = *puVar8;
    lStack_f68 = plVar4[3];
  }
  else {
    local_f70 = *puVar8;
    local_f80 = (ulong *)*plVar4;
  }
  local_f78 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_858 = &local_848;
  std::__cxx11::string::_M_construct((ulong)&local_858,cVar11);
  uVar14 = 0xf;
  if (local_f80 != &local_f70) {
    uVar14 = local_f70;
  }
  if (uVar14 < (ulong)(local_850 + local_f78)) {
    uVar14 = 0xf;
    if (local_858 != &local_848) {
      uVar14 = local_848;
    }
    if (uVar14 < (ulong)(local_850 + local_f78)) goto LAB_002860ee;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_858,0,(char *)0x0,(ulong)local_f80);
  }
  else {
LAB_002860ee:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f80,(ulong)local_858);
  }
  local_778 = &local_768;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_768 = *plVar4;
    lStack_760 = puVar5[3];
  }
  else {
    local_768 = *plVar4;
    local_778 = (long *)*puVar5;
  }
  local_770 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_778);
  local_9f8 = &local_9e8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_9e8 = *puVar8;
    lStack_9e0 = plVar4[3];
  }
  else {
    local_9e8 = *puVar8;
    local_9f8 = (ulong *)*plVar4;
  }
  local_9f0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_878 = &local_868;
  std::__cxx11::string::_M_construct((ulong)&local_878,cVar11);
  uVar14 = 0xf;
  if (local_9f8 != &local_9e8) {
    uVar14 = local_9e8;
  }
  if (uVar14 < (ulong)(local_870 + local_9f0)) {
    uVar14 = 0xf;
    if (local_878 != &local_868) {
      uVar14 = local_868;
    }
    if (uVar14 < (ulong)(local_870 + local_9f0)) goto LAB_00286246;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_878,0,(char *)0x0,(ulong)local_9f8);
  }
  else {
LAB_00286246:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9f8,(ulong)local_878);
  }
  local_758 = &local_748;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_748 = *plVar4;
    lStack_740 = puVar5[3];
  }
  else {
    local_748 = *plVar4;
    local_758 = (long *)*puVar5;
  }
  local_750 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_758);
  local_9d8 = &local_9c8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_9c8 = *puVar8;
    lStack_9c0 = plVar4[3];
  }
  else {
    local_9c8 = *puVar8;
    local_9d8 = (ulong *)*plVar4;
  }
  local_9d0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_898 = &local_888;
  std::__cxx11::string::_M_construct((ulong)&local_898,cVar12);
  uVar14 = 0xf;
  if (local_9d8 != &local_9c8) {
    uVar14 = local_9c8;
  }
  if (uVar14 < (ulong)(local_890 + local_9d0)) {
    uVar14 = 0xf;
    if (local_898 != &local_888) {
      uVar14 = local_888;
    }
    if (uVar14 < (ulong)(local_890 + local_9d0)) goto LAB_002863a1;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_898,0,(char *)0x0,(ulong)local_9d8);
  }
  else {
LAB_002863a1:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9d8,(ulong)local_898);
  }
  local_738 = &local_728;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_728 = *plVar4;
    lStack_720 = puVar5[3];
  }
  else {
    local_728 = *plVar4;
    local_738 = (long *)*puVar5;
  }
  local_730 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_738);
  local_438 = &local_428;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_428 = *plVar7;
    lStack_420 = plVar4[3];
  }
  else {
    local_428 = *plVar7;
    local_438 = (long *)*plVar4;
  }
  local_430 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_438,(ulong)(rel_name->_M_dataplus)._M_p);
  local_9b8 = &local_9a8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_9a8 = *puVar8;
    lStack_9a0 = plVar4[3];
  }
  else {
    local_9a8 = *puVar8;
    local_9b8 = (ulong *)*plVar4;
  }
  local_9b0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_9b8);
  local_998 = &local_988;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_988 = *plVar7;
    lStack_980 = plVar4[3];
  }
  else {
    local_988 = *plVar7;
    local_998 = (long *)*plVar4;
  }
  local_990 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_998,(ulong)local_fa0);
  local_918 = &local_908;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_908 = *puVar8;
    lStack_900 = plVar4[3];
  }
  else {
    local_908 = *puVar8;
    local_918 = (ulong *)*plVar4;
  }
  local_910 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_918);
  local_bf8 = &local_be8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_be8 = *plVar7;
    lStack_be0 = plVar4[3];
  }
  else {
    local_be8 = *plVar7;
    local_bf8 = (long *)*plVar4;
  }
  local_bf0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_bf8,(ulong)local_158._M_dataplus._M_p);
  local_418 = &local_408;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_408 = *plVar7;
    lStack_400 = plVar4[3];
  }
  else {
    local_408 = *plVar7;
    local_418 = (long *)*plVar4;
  }
  local_410 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_418);
  local_978 = &local_968;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_968 = *puVar8;
    lStack_960 = plVar4[3];
  }
  else {
    local_968 = *puVar8;
    local_978 = (ulong *)*plVar4;
  }
  local_970 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_8b8 = &local_8a8;
  std::__cxx11::string::_M_construct((ulong)&local_8b8,cVar12);
  uVar14 = 0xf;
  if (local_978 != &local_968) {
    uVar14 = local_968;
  }
  if (uVar14 < (ulong)(local_8b0 + local_970)) {
    uVar14 = 0xf;
    if (local_8b8 != &local_8a8) {
      uVar14 = local_8a8;
    }
    if (uVar14 < (ulong)(local_8b0 + local_970)) goto LAB_0028674e;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_8b8,0,(char *)0x0,(ulong)local_978);
  }
  else {
LAB_0028674e:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_978,(ulong)local_8b8);
  }
  local_718 = &local_708;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_708 = *plVar4;
    lStack_700 = puVar5[3];
  }
  else {
    local_708 = *plVar4;
    local_718 = (long *)*puVar5;
  }
  local_710 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_718);
  local_958 = &local_948;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_948 = *puVar8;
    lStack_940 = plVar4[3];
  }
  else {
    local_948 = *puVar8;
    local_958 = (ulong *)*plVar4;
  }
  local_950 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_8d8 = &local_8c8;
  std::__cxx11::string::_M_construct((ulong)&local_8d8,cVar11);
  uVar14 = 0xf;
  if (local_958 != &local_948) {
    uVar14 = local_948;
  }
  if (uVar14 < (ulong)(local_8d0 + local_950)) {
    uVar14 = 0xf;
    if (local_8d8 != &local_8c8) {
      uVar14 = local_8c8;
    }
    if (uVar14 < (ulong)(local_8d0 + local_950)) goto LAB_002868a9;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_8d8,0,(char *)0x0,(ulong)local_958);
  }
  else {
LAB_002868a9:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_958,(ulong)local_8d8);
  }
  local_de0 = &local_dd0;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_dd0 = *puVar8;
    lStack_dc8 = puVar5[3];
  }
  else {
    local_dd0 = *puVar8;
    local_de0 = (ulong *)*puVar5;
  }
  local_dd8 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_de0);
  local_f60 = &local_f50;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_f50 = *puVar8;
    lStack_f48 = plVar4[3];
  }
  else {
    local_f50 = *puVar8;
    local_f60 = (ulong *)*plVar4;
  }
  local_f58 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_8f8 = &local_8e8;
  std::__cxx11::string::_M_construct((ulong)&local_8f8,cVar10);
  uVar14 = 0xf;
  if (local_f60 != &local_f50) {
    uVar14 = local_f50;
  }
  if (uVar14 < (ulong)(local_8f0 + local_f58)) {
    uVar14 = 0xf;
    if (local_8f8 != &local_8e8) {
      uVar14 = local_8e8;
    }
    if (uVar14 < (ulong)(local_8f0 + local_f58)) goto LAB_002869ec;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_8f8,0,(char *)0x0,(ulong)local_f60);
  }
  else {
LAB_002869ec:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f60,(ulong)local_8f8);
  }
  local_6f8 = &local_6e8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_6e8 = *plVar4;
    lStack_6e0 = puVar5[3];
  }
  else {
    local_6e8 = *plVar4;
    local_6f8 = (long *)*puVar5;
  }
  local_6f0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_6f8);
  local_138 = &local_dc0->field_2;
  (local_dc0->_M_dataplus)._M_p = (pointer)local_138;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar9) {
    lVar3 = plVar4[3];
    local_138->_M_allocated_capacity = *psVar9;
    *(long *)((long)&local_dc0->field_2 + 8) = lVar3;
  }
  else {
    (local_dc0->_M_dataplus)._M_p = (pointer)*plVar4;
    (local_dc0->field_2)._M_allocated_capacity = *psVar9;
  }
  local_dc0->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_6f8 != &local_6e8) {
    operator_delete(local_6f8);
  }
  if (local_8f8 != &local_8e8) {
    operator_delete(local_8f8);
  }
  if (local_f60 != &local_f50) {
    operator_delete(local_f60);
  }
  if (local_de0 != &local_dd0) {
    operator_delete(local_de0);
  }
  if (local_8d8 != &local_8c8) {
    operator_delete(local_8d8);
  }
  if (local_958 != &local_948) {
    operator_delete(local_958);
  }
  if (local_718 != &local_708) {
    operator_delete(local_718);
  }
  if (local_8b8 != &local_8a8) {
    operator_delete(local_8b8);
  }
  if (local_978 != &local_968) {
    operator_delete(local_978);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418);
  }
  if (local_bf8 != &local_be8) {
    operator_delete(local_bf8);
  }
  if (local_918 != &local_908) {
    operator_delete(local_918);
  }
  if (local_998 != &local_988) {
    operator_delete(local_998);
  }
  if (local_9b8 != &local_9a8) {
    operator_delete(local_9b8);
  }
  if (local_438 != &local_428) {
    operator_delete(local_438);
  }
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  if (local_898 != &local_888) {
    operator_delete(local_898);
  }
  if (local_9d8 != &local_9c8) {
    operator_delete(local_9d8);
  }
  if (local_758 != &local_748) {
    operator_delete(local_758);
  }
  if (local_878 != &local_868) {
    operator_delete(local_878);
  }
  if (local_9f8 != &local_9e8) {
    operator_delete(local_9f8);
  }
  if (local_778 != &local_768) {
    operator_delete(local_778);
  }
  if (local_858 != &local_848) {
    operator_delete(local_858);
  }
  if (local_f80 != &local_f70) {
    operator_delete(local_f80);
  }
  if (local_e00 != &local_df0) {
    operator_delete(local_e00);
  }
  if (local_838 != &local_828) {
    operator_delete(local_838);
  }
  if (local_f00 != &local_ef0) {
    operator_delete(local_f00);
  }
  if (local_d38 != &local_d28) {
    operator_delete(local_d38);
  }
  if (local_a18 != &local_a08) {
    operator_delete(local_a18);
  }
  if (local_d58 != &local_d48) {
    operator_delete(local_d58);
  }
  if (local_a38 != &local_a28) {
    operator_delete(local_a38);
  }
  if (local_a58 != &local_a48) {
    operator_delete(local_a58);
  }
  if (local_c18 != &local_c08) {
    operator_delete(local_c18);
  }
  if (local_a78 != &local_a68) {
    operator_delete(local_a78);
  }
  if (local_c38 != &local_c28) {
    operator_delete(local_c38);
  }
  if (local_a98 != &local_a88) {
    operator_delete(local_a98);
  }
  if (local_458 != &local_448) {
    operator_delete(local_458);
  }
  if (local_798 != &local_788) {
    operator_delete(local_798);
  }
  if (local_818 != &local_808) {
    operator_delete(local_818);
  }
  if (local_ab8 != &local_aa8) {
    operator_delete(local_ab8);
  }
  if (local_7b8 != &local_7a8) {
    operator_delete(local_7b8);
  }
  if (local_db8 != &local_da8) {
    operator_delete(local_db8);
  }
  if (local_ad8 != &local_ac8) {
    operator_delete(local_ad8);
  }
  if (local_478 != &local_468) {
    operator_delete(local_478);
  }
  if (local_c58 != &local_c48) {
    operator_delete(local_c58);
  }
  if (local_af8 != &local_ae8) {
    operator_delete(local_af8);
  }
  if (local_c78 != &local_c68) {
    operator_delete(local_c78);
  }
  if (local_b18 != &local_b08) {
    operator_delete(local_b18);
  }
  if (local_c98 != &local_c88) {
    operator_delete(local_c98);
  }
  if (local_e20 != &local_e10) {
    operator_delete(local_e20);
  }
  if (local_ee0 != &local_ed0) {
    operator_delete(local_ee0);
  }
  if (local_b38 != &local_b28) {
    operator_delete(local_b38);
  }
  if (local_7d8 != &local_7c8) {
    operator_delete(local_7d8);
  }
  if (local_d98 != &local_d88) {
    operator_delete(local_d98);
  }
  if (local_b58 != &local_b48) {
    operator_delete(local_b58);
  }
  if (local_498 != &local_488) {
    operator_delete(local_498);
  }
  if (local_cb8 != &local_ca8) {
    operator_delete(local_cb8);
  }
  if (local_b78 != &local_b68) {
    operator_delete(local_b78);
  }
  if (local_cd8 != &local_cc8) {
    operator_delete(local_cd8);
  }
  if (local_e40 != &local_e30) {
    operator_delete(local_e40);
  }
  if (local_ec0 != &local_eb0) {
    operator_delete(local_ec0);
  }
  if (local_b98 != &local_b88) {
    operator_delete(local_b98);
  }
  if (local_7f8 != &local_7e8) {
    operator_delete(local_7f8);
  }
  if (local_d78 != &local_d68) {
    operator_delete(local_d78);
  }
  if (local_938 != &local_928) {
    operator_delete(local_938);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518);
  }
  if (local_538 != &local_528) {
    operator_delete(local_538);
  }
  if (local_558 != &local_548) {
    operator_delete(local_558);
  }
  if (local_578 != &local_568) {
    operator_delete(local_578);
  }
  if (local_598 != &local_588) {
    operator_delete(local_598);
  }
  if (local_5b8 != &local_5a8) {
    operator_delete(local_5b8);
  }
  if (local_5d8 != &local_5c8) {
    operator_delete(local_5d8);
  }
  if (local_cf8 != &local_ce8) {
    operator_delete(local_cf8);
  }
  if (local_e60 != &local_e50) {
    operator_delete(local_e60);
  }
  if (local_ea0 != &local_e90) {
    operator_delete(local_ea0);
  }
  if (local_f20 != &local_f10) {
    operator_delete(local_f20);
  }
  if (local_e80 != &local_e70) {
    operator_delete(local_e80);
  }
  if (local_6d8 != &local_6c8) {
    operator_delete(local_6d8);
  }
  if (local_f40 != &local_f30) {
    operator_delete(local_f40);
  }
  if (local_bb8 != &local_ba8) {
    operator_delete(local_bb8);
  }
  if (local_d18 != &local_d08) {
    operator_delete(local_d18);
  }
  if (local_bd8 != &local_bc8) {
    operator_delete(local_bd8);
  }
  if (local_5f8 != &local_5e8) {
    operator_delete(local_5f8);
  }
  if (local_618 != &local_608) {
    operator_delete(local_618);
  }
  if (local_638 != &local_628) {
    operator_delete(local_638);
  }
  if (local_658 != &local_648) {
    operator_delete(local_658);
  }
  if (local_678 != &local_668) {
    operator_delete(local_678);
  }
  if (local_698 != &local_688) {
    operator_delete(local_698);
  }
  if (local_6b8 != &local_6a8) {
    operator_delete(local_6b8);
  }
  if (local_3f8 != &local_3e8) {
    operator_delete(local_3f8);
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,cVar10);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_70);
  local_3d8 = &local_3c8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_3c8 = *puVar8;
    lStack_3c0 = plVar4[3];
  }
  else {
    local_3c8 = *puVar8;
    local_3d8 = (ulong *)*plVar4;
  }
  local_3d0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_198 = local_188;
  std::__cxx11::string::_M_construct((ulong)&local_198,cVar10);
  uVar14 = 0xf;
  if (local_3d8 != &local_3c8) {
    uVar14 = local_3c8;
  }
  if (uVar14 < (ulong)(local_190 + local_3d0)) {
    uVar14 = 0xf;
    if (local_198 != local_188) {
      uVar14 = local_188[0];
    }
    if (uVar14 < (ulong)(local_190 + local_3d0)) goto LAB_002874ec;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_3d8);
  }
  else {
LAB_002874ec:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3d8,(ulong)local_198);
  }
  local_178 = &local_168;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_168 = *puVar1;
    uStack_160 = puVar5[3];
  }
  else {
    local_168 = *puVar1;
    local_178 = (undefined8 *)*puVar5;
  }
  local_170 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_b0 = &local_a0;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar4[3];
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(attrName->_M_dataplus)._M_p);
  local_90 = &local_80;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar4[3];
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_8f8 = &local_8e8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_8e8 = *puVar8;
    lStack_8e0 = plVar4[3];
  }
  else {
    local_8e8 = *puVar8;
    local_8f8 = (ulong *)*plVar4;
  }
  local_8f0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_8f8,(ulong)(rel_name->_M_dataplus)._M_p);
  local_8d8 = &local_8c8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_8c8 = *puVar8;
    lStack_8c0 = plVar4[3];
  }
  else {
    local_8c8 = *puVar8;
    local_8d8 = (ulong *)*plVar4;
  }
  local_8d0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_8d8);
  local_8b8 = &local_8a8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_8a8 = *puVar8;
    lStack_8a0 = plVar4[3];
  }
  else {
    local_8a8 = *puVar8;
    local_8b8 = (ulong *)*plVar4;
  }
  local_8b0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_8b8,(ulong)(rel_name->_M_dataplus)._M_p);
  local_898 = &local_888;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_888 = *puVar8;
    lStack_880 = plVar4[3];
  }
  else {
    local_888 = *puVar8;
    local_898 = (ulong *)*plVar4;
  }
  local_890 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_898);
  local_878 = &local_868;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_868 = *puVar8;
    lStack_860 = plVar4[3];
  }
  else {
    local_868 = *puVar8;
    local_878 = (ulong *)*plVar4;
  }
  local_870 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_878,(ulong)local_fa0);
  local_858 = &local_848;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_848 = *puVar8;
    lStack_840 = plVar4[3];
  }
  else {
    local_848 = *puVar8;
    local_858 = (ulong *)*plVar4;
  }
  local_850 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_858);
  local_838 = &local_828;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_828 = *puVar8;
    lStack_820 = plVar4[3];
  }
  else {
    local_828 = *puVar8;
    local_838 = (ulong *)*plVar4;
  }
  local_830 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_838,(ulong)(attrName->_M_dataplus)._M_p);
  local_818 = &local_808;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_808 = *puVar8;
    lStack_800 = plVar4[3];
  }
  else {
    local_808 = *puVar8;
    local_818 = (ulong *)*plVar4;
  }
  local_810 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_818);
  local_db8 = &local_da8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_da8 = *puVar8;
    lStack_da0 = plVar4[3];
  }
  else {
    local_da8 = *puVar8;
    local_db8 = (ulong *)*plVar4;
  }
  local_db0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,cVar10);
  uVar14 = 0xf;
  if (local_db8 != &local_da8) {
    uVar14 = local_da8;
  }
  if (uVar14 < (ulong)(local_1b0 + local_db0)) {
    uVar14 = 0xf;
    if (local_1b8 != local_1a8) {
      uVar14 = local_1a8[0];
    }
    if (uVar14 < (ulong)(local_1b0 + local_db0)) goto LAB_00287a3c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_db8);
  }
  else {
LAB_00287a3c:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_db8,(ulong)local_1b8);
  }
  local_ee0 = &local_ed0;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_ed0 = *puVar8;
    uStack_ec8 = puVar5[3];
  }
  else {
    local_ed0 = *puVar8;
    local_ee0 = (ulong *)*puVar5;
  }
  local_ed8 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_ee0);
  local_d98 = &local_d88;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_d88 = *puVar8;
    lStack_d80 = plVar4[3];
  }
  else {
    local_d88 = *puVar8;
    local_d98 = (ulong *)*plVar4;
  }
  local_d90 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,cVar11);
  uVar14 = 0xf;
  if (local_d98 != &local_d88) {
    uVar14 = local_d88;
  }
  if (uVar14 < (ulong)(local_1d0 + local_d90)) {
    uVar14 = 0xf;
    if (local_1d8 != local_1c8) {
      uVar14 = local_1c8[0];
    }
    if (uVar14 < (ulong)(local_1d0 + local_d90)) goto LAB_00287b9f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_d98);
  }
  else {
LAB_00287b9f:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d98,(ulong)local_1d8);
  }
  local_ec0 = &local_eb0;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_eb0 = *puVar8;
    uStack_ea8 = puVar5[3];
  }
  else {
    local_eb0 = *puVar8;
    local_ec0 = (ulong *)*puVar5;
  }
  local_eb8 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_ec0);
  local_d78 = &local_d68;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_d68 = *puVar8;
    lStack_d60 = plVar4[3];
  }
  else {
    local_d68 = *puVar8;
    local_d78 = (ulong *)*plVar4;
  }
  local_d70 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,cVar11);
  uVar14 = 0xf;
  if (local_d78 != &local_d68) {
    uVar14 = local_d68;
  }
  if (uVar14 < (ulong)(local_1f0 + local_d70)) {
    uVar14 = 0xf;
    if (local_1f8 != local_1e8) {
      uVar14 = local_1e8[0];
    }
    if (uVar14 < (ulong)(local_1f0 + local_d70)) goto LAB_00287d02;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_d78);
  }
  else {
LAB_00287d02:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d78,(ulong)local_1f8);
  }
  local_ea0 = &local_e90;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_e90 = *puVar8;
    uStack_e88 = puVar5[3];
  }
  else {
    local_e90 = *puVar8;
    local_ea0 = (ulong *)*puVar5;
  }
  local_e98 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_ea0);
  local_6d8 = &local_6c8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_6c8 = *puVar8;
    lStack_6c0 = plVar4[3];
  }
  else {
    local_6c8 = *puVar8;
    local_6d8 = (ulong *)*plVar4;
  }
  local_6d0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_6d8,(ulong)(rel_name->_M_dataplus)._M_p);
  local_3f8 = &local_3e8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_3e8 = *plVar7;
    lStack_3e0 = plVar4[3];
  }
  else {
    local_3e8 = *plVar7;
    local_3f8 = (long *)*plVar4;
  }
  local_3f0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_3f8);
  local_6b8 = &local_6a8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_6a8 = *plVar7;
    lStack_6a0 = plVar4[3];
  }
  else {
    local_6a8 = *plVar7;
    local_6b8 = (long *)*plVar4;
  }
  local_6b0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_6b8,(ulong)local_fa0);
  local_698 = &local_688;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_688 = *plVar7;
    lStack_680 = plVar4[3];
  }
  else {
    local_688 = *plVar7;
    local_698 = (long *)*plVar4;
  }
  local_690 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_698);
  local_678 = &local_668;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_668 = *plVar7;
    lStack_660 = plVar4[3];
  }
  else {
    local_668 = *plVar7;
    local_678 = (long *)*plVar4;
  }
  local_670 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_678);
  local_658 = &local_648;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_648 = *plVar7;
    lStack_640 = plVar4[3];
  }
  else {
    local_648 = *plVar7;
    local_658 = (long *)*plVar4;
  }
  local_650 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_658,(ulong)(rel_name->_M_dataplus)._M_p);
  local_638 = &local_628;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_628 = *plVar7;
    lStack_620 = plVar4[3];
  }
  else {
    local_628 = *plVar7;
    local_638 = (long *)*plVar4;
  }
  local_630 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_638);
  local_618 = &local_608;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_608 = *plVar7;
    lStack_600 = plVar4[3];
  }
  else {
    local_608 = *plVar7;
    local_618 = (long *)*plVar4;
  }
  local_610 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_618,(ulong)local_fa0);
  local_5f8 = &local_5e8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_5e8 = *plVar7;
    lStack_5e0 = plVar4[3];
  }
  else {
    local_5e8 = *plVar7;
    local_5f8 = (long *)*plVar4;
  }
  local_5f0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_5f8);
  local_bd8 = &local_bc8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_bc8 = *puVar8;
    lStack_bc0 = plVar4[3];
  }
  else {
    local_bc8 = *puVar8;
    local_bd8 = (ulong *)*plVar4;
  }
  local_bd0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_218 = local_208;
  std::__cxx11::string::_M_construct((ulong)&local_218,cVar11);
  uVar14 = 0xf;
  if (local_bd8 != &local_bc8) {
    uVar14 = local_bc8;
  }
  if (uVar14 < (ulong)(local_210 + local_bd0)) {
    uVar14 = 0xf;
    if (local_218 != local_208) {
      uVar14 = local_208[0];
    }
    if (uVar14 < (ulong)(local_210 + local_bd0)) goto LAB_002881f8;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_bd8);
  }
  else {
LAB_002881f8:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_bd8,(ulong)local_218);
  }
  local_d18 = &local_d08;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_d08 = *plVar4;
    lStack_d00 = puVar5[3];
  }
  else {
    local_d08 = *plVar4;
    local_d18 = (long *)*puVar5;
  }
  local_d10 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d18);
  local_bb8 = &local_ba8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_ba8 = *puVar8;
    lStack_ba0 = plVar4[3];
  }
  else {
    local_ba8 = *puVar8;
    local_bb8 = (ulong *)*plVar4;
  }
  local_bb0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_238 = local_228;
  std::__cxx11::string::_M_construct((ulong)&local_238,cVar11);
  uVar14 = 0xf;
  if (local_bb8 != &local_ba8) {
    uVar14 = local_ba8;
  }
  if (uVar14 < (ulong)(local_230 + local_bb0)) {
    uVar14 = 0xf;
    if (local_238 != local_228) {
      uVar14 = local_228[0];
    }
    if (uVar14 < (ulong)(local_230 + local_bb0)) goto LAB_0028835b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_bb8);
  }
  else {
LAB_0028835b:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_bb8,(ulong)local_238);
  }
  local_f40 = &local_f30;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_f30 = *puVar8;
    lStack_f28 = puVar5[3];
  }
  else {
    local_f30 = *puVar8;
    local_f40 = (ulong *)*puVar5;
  }
  local_f38 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f40);
  local_e80 = &local_e70;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_e70 = *puVar8;
    lStack_e68 = plVar4[3];
  }
  else {
    local_e70 = *puVar8;
    local_e80 = (ulong *)*plVar4;
  }
  local_e78 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_258 = local_248;
  std::__cxx11::string::_M_construct((ulong)&local_258,cVar12);
  uVar14 = 0xf;
  if (local_e80 != &local_e70) {
    uVar14 = local_e70;
  }
  if (uVar14 < (ulong)(local_250 + local_e78)) {
    uVar14 = 0xf;
    if (local_258 != local_248) {
      uVar14 = local_248[0];
    }
    if (uVar14 < (ulong)(local_250 + local_e78)) goto LAB_002884ac;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_e80);
  }
  else {
LAB_002884ac:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e80,(ulong)local_258);
  }
  local_f20 = &local_f10;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_f10 = *puVar8;
    lStack_f08 = puVar5[3];
  }
  else {
    local_f10 = *puVar8;
    local_f20 = (ulong *)*puVar5;
  }
  local_f18 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f20);
  local_e60 = &local_e50;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_e50 = *puVar8;
    lStack_e48 = plVar4[3];
  }
  else {
    local_e50 = *puVar8;
    local_e60 = (ulong *)*plVar4;
  }
  local_e58 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_278 = local_268;
  std::__cxx11::string::_M_construct((ulong)&local_278,cVar12);
  uVar14 = 0xf;
  if (local_e60 != &local_e50) {
    uVar14 = local_e50;
  }
  if (uVar14 < (ulong)(local_270 + local_e58)) {
    uVar14 = 0xf;
    if (local_278 != local_268) {
      uVar14 = local_268[0];
    }
    if (uVar14 < (ulong)(local_270 + local_e58)) goto LAB_0028860f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_e60);
  }
  else {
LAB_0028860f:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e60,(ulong)local_278);
  }
  local_cf8 = &local_ce8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_ce8 = *plVar4;
    lStack_ce0 = puVar5[3];
  }
  else {
    local_ce8 = *plVar4;
    local_cf8 = (long *)*puVar5;
  }
  local_cf0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_cf8);
  local_5d8 = &local_5c8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_5c8 = *plVar7;
    lStack_5c0 = plVar4[3];
  }
  else {
    local_5c8 = *plVar7;
    local_5d8 = (long *)*plVar4;
  }
  local_5d0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_5d8,(ulong)(attrName->_M_dataplus)._M_p);
  local_5b8 = &local_5a8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_5a8 = *plVar7;
    lStack_5a0 = plVar4[3];
  }
  else {
    local_5a8 = *plVar7;
    local_5b8 = (long *)*plVar4;
  }
  local_5b0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_5b8);
  local_598 = &local_588;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_588 = *plVar7;
    lStack_580 = plVar4[3];
  }
  else {
    local_588 = *plVar7;
    local_598 = (long *)*plVar4;
  }
  local_590 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_598,(ulong)(rel_name->_M_dataplus)._M_p);
  local_578 = &local_568;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_568 = *plVar7;
    lStack_560 = plVar4[3];
  }
  else {
    local_568 = *plVar7;
    local_578 = (long *)*plVar4;
  }
  local_570 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_578);
  local_558 = &local_548;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_548 = *plVar7;
    lStack_540 = plVar4[3];
  }
  else {
    local_548 = *plVar7;
    local_558 = (long *)*plVar4;
  }
  local_550 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_558,(ulong)(attrName->_M_dataplus)._M_p);
  local_538 = &local_528;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_528 = *plVar7;
    lStack_520 = plVar4[3];
  }
  else {
    local_528 = *plVar7;
    local_538 = (long *)*plVar4;
  }
  local_530 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_538);
  local_518 = &local_508;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_508 = *plVar7;
    lStack_500 = plVar4[3];
  }
  else {
    local_508 = *plVar7;
    local_518 = (long *)*plVar4;
  }
  local_510 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_518);
  local_4f8 = &local_4e8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_4e8 = *plVar7;
    lStack_4e0 = plVar4[3];
  }
  else {
    local_4e8 = *plVar7;
    local_4f8 = (long *)*plVar4;
  }
  local_4f0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_4f8,(ulong)(attrName->_M_dataplus)._M_p);
  local_4d8 = &local_4c8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_4c8 = *plVar7;
    lStack_4c0 = plVar4[3];
  }
  else {
    local_4c8 = *plVar7;
    local_4d8 = (long *)*plVar4;
  }
  local_4d0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_4d8);
  local_4b8 = &local_4a8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_4a8 = *plVar7;
    lStack_4a0 = plVar4[3];
  }
  else {
    local_4a8 = *plVar7;
    local_4b8 = (long *)*plVar4;
  }
  local_4b0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_4b8,(ulong)(rel_name->_M_dataplus)._M_p);
  local_938 = &local_928;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_928 = *puVar8;
    lStack_920 = plVar4[3];
  }
  else {
    local_928 = *puVar8;
    local_938 = (ulong *)*plVar4;
  }
  local_930 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_938);
  local_7f8 = &local_7e8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_7e8 = *plVar7;
    lStack_7e0 = plVar4[3];
  }
  else {
    local_7e8 = *plVar7;
    local_7f8 = (long *)*plVar4;
  }
  local_7f0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_7f8,(ulong)(attrName->_M_dataplus)._M_p);
  local_b98 = &local_b88;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_b88 = *puVar8;
    lStack_b80 = plVar4[3];
  }
  else {
    local_b88 = *puVar8;
    local_b98 = (ulong *)*plVar4;
  }
  local_b90 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b98);
  local_e40 = &local_e30;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_e30 = *puVar8;
    lStack_e28 = plVar4[3];
  }
  else {
    local_e30 = *puVar8;
    local_e40 = (ulong *)*plVar4;
  }
  local_e38 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_298 = local_288;
  std::__cxx11::string::_M_construct((ulong)&local_298,cVar12);
  uVar14 = 0xf;
  if (local_e40 != &local_e30) {
    uVar14 = local_e30;
  }
  if (uVar14 < (ulong)(local_290 + local_e38)) {
    uVar14 = 0xf;
    if (local_298 != local_288) {
      uVar14 = local_288[0];
    }
    if (uVar14 < (ulong)(local_290 + local_e38)) goto LAB_00288c9b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_e40);
  }
  else {
LAB_00288c9b:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e40,(ulong)local_298);
  }
  local_cd8 = &local_cc8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_cc8 = *plVar4;
    lStack_cc0 = puVar5[3];
  }
  else {
    local_cc8 = *plVar4;
    local_cd8 = (long *)*puVar5;
  }
  local_cd0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_cd8);
  local_b78 = &local_b68;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_b68 = *puVar8;
    lStack_b60 = plVar4[3];
  }
  else {
    local_b68 = *puVar8;
    local_b78 = (ulong *)*plVar4;
  }
  local_b70 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  cVar13 = cVar13 + '\x1b';
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct((ulong)&local_2b8,cVar13);
  uVar14 = 0xf;
  if (local_b78 != &local_b68) {
    uVar14 = local_b68;
  }
  if (uVar14 < (ulong)(local_2b0 + local_b70)) {
    uVar14 = 0xf;
    if (local_2b8 != local_2a8) {
      uVar14 = local_2a8[0];
    }
    if (uVar14 < (ulong)(local_2b0 + local_b70)) goto LAB_00288e02;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_b78);
  }
  else {
LAB_00288e02:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b78,(ulong)local_2b8);
  }
  local_cb8 = &local_ca8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_ca8 = *plVar4;
    lStack_ca0 = puVar5[3];
  }
  else {
    local_ca8 = *plVar4;
    local_cb8 = (long *)*puVar5;
  }
  local_cb0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_cb8);
  local_498 = &local_488;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_488 = *plVar7;
    lStack_480 = plVar4[3];
  }
  else {
    local_488 = *plVar7;
    local_498 = (long *)*plVar4;
  }
  local_490 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_498,(ulong)(rel_name->_M_dataplus)._M_p);
  local_b58 = &local_b48;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_b48 = *puVar8;
    lStack_b40 = plVar4[3];
  }
  else {
    local_b48 = *puVar8;
    local_b58 = (ulong *)*plVar4;
  }
  local_b50 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b58);
  local_7d8 = &local_7c8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_7c8 = *plVar7;
    lStack_7c0 = plVar4[3];
  }
  else {
    local_7c8 = *plVar7;
    local_7d8 = (long *)*plVar4;
  }
  local_7d0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_7d8,(ulong)local_fa0);
  local_b38 = &local_b28;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_b28 = *puVar8;
    lStack_b20 = plVar4[3];
  }
  else {
    local_b28 = *puVar8;
    local_b38 = (ulong *)*plVar4;
  }
  local_b30 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b38);
  local_e20 = &local_e10;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_e10 = *puVar8;
    lStack_e08 = plVar4[3];
  }
  else {
    local_e10 = *puVar8;
    local_e20 = (ulong *)*plVar4;
  }
  local_e18 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct((ulong)&local_2d8,cVar13);
  uVar14 = 0xf;
  if (local_e20 != &local_e10) {
    uVar14 = local_e10;
  }
  if (uVar14 < (ulong)(local_2d0 + local_e18)) {
    uVar14 = 0xf;
    if (local_2d8 != local_2c8) {
      uVar14 = local_2c8[0];
    }
    if (uVar14 < (ulong)(local_2d0 + local_e18)) goto LAB_002890fc;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,(ulong)local_e20);
  }
  else {
LAB_002890fc:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e20,(ulong)local_2d8);
  }
  local_c98 = &local_c88;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_c88 = *plVar4;
    lStack_c80 = puVar5[3];
  }
  else {
    local_c88 = *plVar4;
    local_c98 = (long *)*puVar5;
  }
  local_c90 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c98);
  local_b18 = &local_b08;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_b08 = *puVar8;
    lStack_b00 = plVar4[3];
  }
  else {
    local_b08 = *puVar8;
    local_b18 = (ulong *)*plVar4;
  }
  local_b10 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct((ulong)&local_2f8,cVar12);
  uVar14 = 0xf;
  if (local_b18 != &local_b08) {
    uVar14 = local_b08;
  }
  if (uVar14 < (ulong)(local_2f0 + local_b10)) {
    uVar14 = 0xf;
    if (local_2f8 != local_2e8) {
      uVar14 = local_2e8[0];
    }
    if (uVar14 < (ulong)(local_2f0 + local_b10)) goto LAB_0028925f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,(ulong)local_b18);
  }
  else {
LAB_0028925f:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b18,(ulong)local_2f8);
  }
  local_c78 = &local_c68;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_c68 = *plVar4;
    lStack_c60 = puVar5[3];
  }
  else {
    local_c68 = *plVar4;
    local_c78 = (long *)*puVar5;
  }
  local_c70 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c78);
  local_af8 = &local_ae8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_ae8 = *puVar8;
    lStack_ae0 = plVar4[3];
  }
  else {
    local_ae8 = *puVar8;
    local_af8 = (ulong *)*plVar4;
  }
  local_af0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_318 = local_308;
  std::__cxx11::string::_M_construct((ulong)&local_318,cVar12);
  uVar14 = 0xf;
  if (local_af8 != &local_ae8) {
    uVar14 = local_ae8;
  }
  if (uVar14 < (ulong)(local_310 + local_af0)) {
    uVar14 = 0xf;
    if (local_318 != local_308) {
      uVar14 = local_308[0];
    }
    if (uVar14 < (ulong)(local_310 + local_af0)) goto LAB_002893c2;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,(ulong)local_af8);
  }
  else {
LAB_002893c2:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_af8,(ulong)local_318);
  }
  local_c58 = &local_c48;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_c48 = *plVar4;
    lStack_c40 = puVar5[3];
  }
  else {
    local_c48 = *plVar4;
    local_c58 = (long *)*puVar5;
  }
  local_c50 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c58);
  local_478 = &local_468;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_468 = *plVar7;
    lStack_460 = plVar4[3];
  }
  else {
    local_468 = *plVar7;
    local_478 = (long *)*plVar4;
  }
  local_470 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_478,(ulong)(attrName->_M_dataplus)._M_p);
  local_ad8 = &local_ac8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_ac8 = *puVar8;
    lStack_ac0 = plVar4[3];
  }
  else {
    local_ac8 = *puVar8;
    local_ad8 = (ulong *)*plVar4;
  }
  local_ad0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_ad8);
  local_7b8 = &local_7a8;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_7a8 = *plVar7;
    lStack_7a0 = plVar4[3];
  }
  else {
    local_7a8 = *plVar7;
    local_7b8 = (long *)*plVar4;
  }
  local_7b0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_7b8,(ulong)(rel_name->_M_dataplus)._M_p);
  local_ab8 = &local_aa8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_aa8 = *puVar8;
    lStack_aa0 = plVar4[3];
  }
  else {
    local_aa8 = *puVar8;
    local_ab8 = (ulong *)*plVar4;
  }
  local_ab0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_ab8);
  local_798 = &local_788;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_788 = *plVar7;
    lStack_780 = plVar4[3];
  }
  else {
    local_788 = *plVar7;
    local_798 = (long *)*plVar4;
  }
  local_790 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_798,(ulong)(attrName->_M_dataplus)._M_p);
  local_458 = &local_448;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_448 = *plVar7;
    lStack_440 = plVar4[3];
  }
  else {
    local_448 = *plVar7;
    local_458 = (long *)*plVar4;
  }
  local_450 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_458);
  local_a98 = &local_a88;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_a88 = *puVar8;
    lStack_a80 = plVar4[3];
  }
  else {
    local_a88 = *puVar8;
    local_a98 = (ulong *)*plVar4;
  }
  local_a90 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_338 = local_328;
  std::__cxx11::string::_M_construct((ulong)&local_338,cVar13);
  uVar14 = 0xf;
  if (local_a98 != &local_a88) {
    uVar14 = local_a88;
  }
  if (uVar14 < (ulong)(local_330 + local_a90)) {
    uVar14 = 0xf;
    if (local_338 != local_328) {
      uVar14 = local_328[0];
    }
    if (uVar14 < (ulong)(local_330 + local_a90)) goto LAB_00289787;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,(ulong)local_a98);
  }
  else {
LAB_00289787:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a98,(ulong)local_338);
  }
  local_c38 = &local_c28;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_c28 = *plVar4;
    lStack_c20 = puVar5[3];
  }
  else {
    local_c28 = *plVar4;
    local_c38 = (long *)*puVar5;
  }
  local_c30 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c38);
  local_a78 = &local_a68;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_a68 = *puVar8;
    lStack_a60 = plVar4[3];
  }
  else {
    local_a68 = *puVar8;
    local_a78 = (ulong *)*plVar4;
  }
  local_a70 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_358 = local_348;
  std::__cxx11::string::_M_construct((ulong)&local_358,cVar12);
  uVar14 = 0xf;
  if (local_a78 != &local_a68) {
    uVar14 = local_a68;
  }
  if (uVar14 < (ulong)(local_350 + local_a70)) {
    uVar14 = 0xf;
    if (local_358 != local_348) {
      uVar14 = local_348[0];
    }
    if (uVar14 < (ulong)(local_350 + local_a70)) goto LAB_002898ea;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,(ulong)local_a78);
  }
  else {
LAB_002898ea:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a78,(ulong)local_358);
  }
  local_c18 = &local_c08;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_c08 = *plVar4;
    lStack_c00 = puVar5[3];
  }
  else {
    local_c08 = *plVar4;
    local_c18 = (long *)*puVar5;
  }
  local_c10 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c18);
  local_a58 = &local_a48;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_a48 = *puVar8;
    lStack_a40 = plVar4[3];
  }
  else {
    local_a48 = *puVar8;
    local_a58 = (ulong *)*plVar4;
  }
  local_a50 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_378 = local_368;
  std::__cxx11::string::_M_construct((ulong)&local_378,cVar13);
  uVar14 = 0xf;
  if (local_a58 != &local_a48) {
    uVar14 = local_a48;
  }
  if (uVar14 < (ulong)(local_370 + local_a50)) {
    uVar14 = 0xf;
    if (local_378 != local_368) {
      uVar14 = local_368[0];
    }
    if (uVar14 < (ulong)(local_370 + local_a50)) goto LAB_00289a55;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)local_a58);
  }
  else {
LAB_00289a55:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a58,(ulong)local_378);
  }
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_a28 = *plVar4;
    lStack_a20 = puVar5[3];
    local_a38 = &local_a28;
  }
  else {
    local_a28 = *plVar4;
    local_a38 = (long *)*puVar5;
  }
  local_a30 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a38);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_d48 = *puVar8;
    lStack_d40 = plVar4[3];
    local_d58 = &local_d48;
  }
  else {
    local_d48 = *puVar8;
    local_d58 = (ulong *)*plVar4;
  }
  local_d50 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_398 = local_388;
  std::__cxx11::string::_M_construct((ulong)&local_398,cVar11);
  uVar14 = 0xf;
  if (local_d58 != &local_d48) {
    uVar14 = local_d48;
  }
  if (uVar14 < (ulong)(local_390 + local_d50)) {
    uVar14 = 0xf;
    if (local_398 != local_388) {
      uVar14 = local_388[0];
    }
    if (uVar14 < (ulong)(local_390 + local_d50)) goto LAB_00289bb2;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_398,0,(char *)0x0,(ulong)local_d58);
  }
  else {
LAB_00289bb2:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d58,(ulong)local_398);
  }
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_a08 = *plVar4;
    lStack_a00 = puVar5[3];
    local_a18 = &local_a08;
  }
  else {
    local_a08 = *plVar4;
    local_a18 = (long *)*puVar5;
  }
  local_a10 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a18);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_d28 = *puVar8;
    lStack_d20 = plVar4[3];
    local_d38 = &local_d28;
  }
  else {
    local_d28 = *puVar8;
    local_d38 = (ulong *)*plVar4;
  }
  local_d30 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_3b8 = local_3a8;
  std::__cxx11::string::_M_construct((ulong)&local_3b8,cVar11);
  uVar14 = 0xf;
  if (local_d38 != &local_d28) {
    uVar14 = local_d28;
  }
  if (uVar14 < (ulong)(local_3b0 + local_d30)) {
    uVar14 = 0xf;
    if (local_3b8 != local_3a8) {
      uVar14 = local_3a8[0];
    }
    if (uVar14 < (ulong)(local_3b0 + local_d30)) goto LAB_00289d0f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3b8,0,(char *)0x0,(ulong)local_d38);
  }
  else {
LAB_00289d0f:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d38,(ulong)local_3b8);
  }
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_ef0 = *puVar8;
    lStack_ee8 = puVar5[3];
    local_f00 = &local_ef0;
  }
  else {
    local_ef0 = *puVar8;
    local_f00 = (ulong *)*puVar5;
  }
  local_ef8 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f00);
  local_e00 = &local_df0;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_df0 = *puVar8;
    lStack_de8 = plVar4[3];
  }
  else {
    local_df0 = *puVar8;
    local_e00 = (ulong *)*plVar4;
  }
  local_df8 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,cVar11);
  uVar14 = 0xf;
  if (local_e00 != &local_df0) {
    uVar14 = local_df0;
  }
  if (uVar14 < (ulong)(local_c8 + local_df8)) {
    uVar14 = 0xf;
    if (local_d0 != local_c0) {
      uVar14 = local_c0[0];
    }
    if (uVar14 < (ulong)(local_c8 + local_df8)) goto LAB_00289e63;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_e00);
  }
  else {
LAB_00289e63:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e00,(ulong)local_d0);
  }
  local_f80 = &local_f70;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_f70 = *puVar8;
    lStack_f68 = puVar5[3];
  }
  else {
    local_f70 = *puVar8;
    local_f80 = (ulong *)*puVar5;
  }
  local_f78 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f80);
  local_778 = &local_768;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_768 = *plVar7;
    lStack_760 = plVar4[3];
  }
  else {
    local_768 = *plVar7;
    local_778 = (long *)*plVar4;
  }
  local_770 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_778,(ulong)(rel_name->_M_dataplus)._M_p);
  local_9f8 = &local_9e8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_9e8 = *puVar8;
    lStack_9e0 = plVar4[3];
  }
  else {
    local_9e8 = *puVar8;
    local_9f8 = (ulong *)*plVar4;
  }
  local_9f0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_9f8);
  local_758 = &local_748;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_748 = *plVar7;
    lStack_740 = plVar4[3];
  }
  else {
    local_748 = *plVar7;
    local_758 = (long *)*plVar4;
  }
  local_750 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_758,(ulong)(attrName->_M_dataplus)._M_p);
  local_9d8 = &local_9c8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_9c8 = *puVar8;
    lStack_9c0 = plVar4[3];
  }
  else {
    local_9c8 = *puVar8;
    local_9d8 = (ulong *)*plVar4;
  }
  local_9d0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_9d8);
  local_738 = &local_728;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_728 = *plVar7;
    lStack_720 = plVar4[3];
  }
  else {
    local_728 = *plVar7;
    local_738 = (long *)*plVar4;
  }
  local_730 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_738,(ulong)(attrName->_M_dataplus)._M_p);
  local_438 = &local_428;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_428 = *plVar7;
    lStack_420 = plVar4[3];
  }
  else {
    local_428 = *plVar7;
    local_438 = (long *)*plVar4;
  }
  local_430 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_438);
  local_9b8 = &local_9a8;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_9a8 = *puVar8;
    lStack_9a0 = plVar4[3];
  }
  else {
    local_9a8 = *puVar8;
    local_9b8 = (ulong *)*plVar4;
  }
  local_9b0 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,cVar12);
  uVar14 = 0xf;
  if (local_9b8 != &local_9a8) {
    uVar14 = local_9a8;
  }
  if (uVar14 < (ulong)(local_e8 + local_9b0)) {
    uVar14 = 0xf;
    if (local_f0 != local_e0) {
      uVar14 = local_e0[0];
    }
    if (uVar14 < (ulong)(local_e8 + local_9b0)) goto LAB_0028a217;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_9b8);
  }
  else {
LAB_0028a217:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9b8,(ulong)local_f0);
  }
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_988 = *plVar4;
    lStack_980 = puVar5[3];
    local_998 = &local_988;
  }
  else {
    local_988 = *plVar4;
    local_998 = (long *)*puVar5;
  }
  local_990 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_998);
  local_918 = &local_908;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_908 = *puVar8;
    lStack_900 = plVar4[3];
  }
  else {
    local_908 = *puVar8;
    local_918 = (ulong *)*plVar4;
  }
  local_910 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_110 = local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,cVar11);
  uVar14 = 0xf;
  if (local_918 != &local_908) {
    uVar14 = local_908;
  }
  if (uVar14 < (ulong)(local_108 + local_910)) {
    uVar14 = 0xf;
    if (local_110 != local_100) {
      uVar14 = local_100[0];
    }
    if (uVar14 < (ulong)(local_108 + local_910)) goto LAB_0028a36a;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_918);
  }
  else {
LAB_0028a36a:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_918,(ulong)local_110);
  }
  local_bf8 = &local_be8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_be8 = *plVar4;
    lStack_be0 = puVar5[3];
  }
  else {
    local_be8 = *plVar4;
    local_bf8 = (long *)*puVar5;
  }
  local_bf0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_bf8);
  local_418 = &local_408;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_408 = *plVar7;
    lStack_400 = plVar4[3];
  }
  else {
    local_408 = *plVar7;
    local_418 = (long *)*plVar4;
  }
  local_410 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_418,(ulong)(rel_name->_M_dataplus)._M_p);
  local_978 = &local_968;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_968 = *puVar8;
    lStack_960 = plVar4[3];
  }
  else {
    local_968 = *puVar8;
    local_978 = (ulong *)*plVar4;
  }
  local_970 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_978);
  local_718 = &local_708;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_708 = *plVar7;
    lStack_700 = plVar4[3];
  }
  else {
    local_708 = *plVar7;
    local_718 = (long *)*plVar4;
  }
  local_710 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_718,(ulong)local_fa0);
  local_958 = &local_948;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_948 = *puVar8;
    lStack_940 = plVar4[3];
  }
  else {
    local_948 = *puVar8;
    local_958 = (ulong *)*plVar4;
  }
  local_950 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_958);
  local_de0 = &local_dd0;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_dd0 = *puVar8;
    lStack_dc8 = plVar4[3];
  }
  else {
    local_dd0 = *puVar8;
    local_de0 = (ulong *)*plVar4;
  }
  local_dd8 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,cVar10);
  uVar14 = 0xf;
  if (local_de0 != &local_dd0) {
    uVar14 = local_dd0;
  }
  if (uVar14 < (ulong)(local_128 + local_dd8)) {
    uVar14 = 0xf;
    if (local_130 != local_120) {
      uVar14 = local_120[0];
    }
    if ((ulong)(local_128 + local_dd8) <= uVar14) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_de0);
      goto LAB_0028a684;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_de0,(ulong)local_130);
LAB_0028a684:
  local_f60 = &local_f50;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_f50 = *puVar8;
    lStack_f48 = puVar5[3];
  }
  else {
    local_f50 = *puVar8;
    local_f60 = (ulong *)*puVar5;
  }
  local_f58 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f60);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_6e8 = *plVar7;
    lStack_6e0 = plVar4[3];
    local_6f8 = &local_6e8;
  }
  else {
    local_6e8 = *plVar7;
    local_6f8 = (long *)*plVar4;
  }
  local_6f0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_dc0,(ulong)local_6f8);
  if (local_6f8 != &local_6e8) {
    operator_delete(local_6f8);
  }
  if (local_f60 != &local_f50) {
    operator_delete(local_f60);
  }
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  if (local_de0 != &local_dd0) {
    operator_delete(local_de0);
  }
  if (local_958 != &local_948) {
    operator_delete(local_958);
  }
  if (local_718 != &local_708) {
    operator_delete(local_718);
  }
  if (local_978 != &local_968) {
    operator_delete(local_978);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418);
  }
  if (local_bf8 != &local_be8) {
    operator_delete(local_bf8);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_918 != &local_908) {
    operator_delete(local_918);
  }
  if (local_998 != &local_988) {
    operator_delete(local_998);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_9b8 != &local_9a8) {
    operator_delete(local_9b8);
  }
  if (local_438 != &local_428) {
    operator_delete(local_438);
  }
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  if (local_9d8 != &local_9c8) {
    operator_delete(local_9d8);
  }
  if (local_758 != &local_748) {
    operator_delete(local_758);
  }
  if (local_9f8 != &local_9e8) {
    operator_delete(local_9f8);
  }
  if (local_778 != &local_768) {
    operator_delete(local_778);
  }
  if (local_f80 != &local_f70) {
    operator_delete(local_f80);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_e00 != &local_df0) {
    operator_delete(local_e00);
  }
  if (local_f00 != &local_ef0) {
    operator_delete(local_f00);
  }
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  if (local_d38 != &local_d28) {
    operator_delete(local_d38);
  }
  if (local_a18 != &local_a08) {
    operator_delete(local_a18);
  }
  if (local_398 != local_388) {
    operator_delete(local_398);
  }
  if (local_d58 != &local_d48) {
    operator_delete(local_d58);
  }
  if (local_a38 != &local_a28) {
    operator_delete(local_a38);
  }
  if (local_378 != local_368) {
    operator_delete(local_378);
  }
  if (local_a58 != &local_a48) {
    operator_delete(local_a58);
  }
  if (local_c18 != &local_c08) {
    operator_delete(local_c18);
  }
  if (local_358 != local_348) {
    operator_delete(local_358);
  }
  if (local_a78 != &local_a68) {
    operator_delete(local_a78);
  }
  if (local_c38 != &local_c28) {
    operator_delete(local_c38);
  }
  if (local_338 != local_328) {
    operator_delete(local_338);
  }
  if (local_a98 != &local_a88) {
    operator_delete(local_a98);
  }
  if (local_458 != &local_448) {
    operator_delete(local_458);
  }
  if (local_798 != &local_788) {
    operator_delete(local_798);
  }
  if (local_ab8 != &local_aa8) {
    operator_delete(local_ab8);
  }
  if (local_7b8 != &local_7a8) {
    operator_delete(local_7b8);
  }
  if (local_ad8 != &local_ac8) {
    operator_delete(local_ad8);
  }
  if (local_478 != &local_468) {
    operator_delete(local_478);
  }
  if (local_c58 != &local_c48) {
    operator_delete(local_c58);
  }
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
  if (local_af8 != &local_ae8) {
    operator_delete(local_af8);
  }
  if (local_c78 != &local_c68) {
    operator_delete(local_c78);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  if (local_b18 != &local_b08) {
    operator_delete(local_b18);
  }
  if (local_c98 != &local_c88) {
    operator_delete(local_c98);
  }
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_e20 != &local_e10) {
    operator_delete(local_e20);
  }
  if (local_b38 != &local_b28) {
    operator_delete(local_b38);
  }
  if (local_7d8 != &local_7c8) {
    operator_delete(local_7d8);
  }
  if (local_b58 != &local_b48) {
    operator_delete(local_b58);
  }
  if (local_498 != &local_488) {
    operator_delete(local_498);
  }
  if (local_cb8 != &local_ca8) {
    operator_delete(local_cb8);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_b78 != &local_b68) {
    operator_delete(local_b78);
  }
  if (local_cd8 != &local_cc8) {
    operator_delete(local_cd8);
  }
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  if (local_e40 != &local_e30) {
    operator_delete(local_e40);
  }
  if (local_b98 != &local_b88) {
    operator_delete(local_b98);
  }
  if (local_7f8 != &local_7e8) {
    operator_delete(local_7f8);
  }
  if (local_938 != &local_928) {
    operator_delete(local_938);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518);
  }
  if (local_538 != &local_528) {
    operator_delete(local_538);
  }
  if (local_558 != &local_548) {
    operator_delete(local_558);
  }
  if (local_578 != &local_568) {
    operator_delete(local_578);
  }
  if (local_598 != &local_588) {
    operator_delete(local_598);
  }
  if (local_5b8 != &local_5a8) {
    operator_delete(local_5b8);
  }
  if (local_5d8 != &local_5c8) {
    operator_delete(local_5d8);
  }
  if (local_cf8 != &local_ce8) {
    operator_delete(local_cf8);
  }
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  if (local_e60 != &local_e50) {
    operator_delete(local_e60);
  }
  if (local_f20 != &local_f10) {
    operator_delete(local_f20);
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  if (local_e80 != &local_e70) {
    operator_delete(local_e80);
  }
  if (local_f40 != &local_f30) {
    operator_delete(local_f40);
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  if (local_bb8 != &local_ba8) {
    operator_delete(local_bb8);
  }
  if (local_d18 != &local_d08) {
    operator_delete(local_d18);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_bd8 != &local_bc8) {
    operator_delete(local_bd8);
  }
  if (local_5f8 != &local_5e8) {
    operator_delete(local_5f8);
  }
  if (local_618 != &local_608) {
    operator_delete(local_618);
  }
  if (local_638 != &local_628) {
    operator_delete(local_638);
  }
  if (local_658 != &local_648) {
    operator_delete(local_658);
  }
  if (local_678 != &local_668) {
    operator_delete(local_678);
  }
  if (local_698 != &local_688) {
    operator_delete(local_698);
  }
  if (local_6b8 != &local_6a8) {
    operator_delete(local_6b8);
  }
  if (local_3f8 != &local_3e8) {
    operator_delete(local_3f8);
  }
  if (local_6d8 != &local_6c8) {
    operator_delete(local_6d8);
  }
  if (local_ea0 != &local_e90) {
    operator_delete(local_ea0);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_d78 != &local_d68) {
    operator_delete(local_d78);
  }
  if (local_ec0 != &local_eb0) {
    operator_delete(local_ec0);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_d98 != &local_d88) {
    operator_delete(local_d98);
  }
  if (local_ee0 != &local_ed0) {
    operator_delete(local_ee0);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_db8 != &local_da8) {
    operator_delete(local_db8);
  }
  if (local_818 != &local_808) {
    operator_delete(local_818);
  }
  if (local_838 != &local_828) {
    operator_delete(local_838);
  }
  if (local_858 != &local_848) {
    operator_delete(local_858);
  }
  if (local_878 != &local_868) {
    operator_delete(local_878);
  }
  if (local_898 != &local_888) {
    operator_delete(local_898);
  }
  if (local_8b8 != &local_8a8) {
    operator_delete(local_8b8);
  }
  if (local_8d8 != &local_8c8) {
    operator_delete(local_8d8);
  }
  if (local_8f8 != &local_8e8) {
    operator_delete(local_8f8);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if (local_3d8 != &local_3c8) {
    operator_delete(local_3d8);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_fa0 != local_f90) {
    operator_delete(local_fa0);
  }
  return local_dc0;
}

Assistant:

std::string CppGenerator::genFindUpperBound(const std::string& rel_name,
                                            const std::string& attrName,
                                            size_t depth, bool parallel)
{
    const std::string depthString = std::to_string(depth);
    const std::string upperPointer = getUpperPointer(rel_name,depth,parallel);
    
    std::string returnString = offset(6+depth)+"min_"+attrName+" = "+
        rel_name+"[lowerptr_"+rel_name+"["+depthString+"]]."+attrName +";\n"+
        offset(6+depth)+"size_t leap = 1;\n"+
        offset(6+depth)+"while (min_"+attrName+" < max_"+attrName+" && "+
        "lowerptr_"+rel_name+"["+depthString+"] <= "+upperPointer+")\n"+
        offset(6+depth)+"{\n"+
        offset(7+depth)+"lowerptr_"+rel_name+"["+depthString+"] += leap;\n"+
        offset(7+depth)+"leap *= 2;\n"+
        offset(7+depth)+"if(lowerptr_"+rel_name+"["+depthString+
        "] < "+upperPointer+")\n"+offset(7+depth)+"{\n"+
        offset(8+depth)+"min_"+attrName+" = "+rel_name+"[lowerptr_"+rel_name+"["+
        depthString+"]]."+attrName+";\n"+
        offset(7+depth)+"}\n"+offset(7+depth)+"else\n"+offset(7+depth)+"{\n"+
        offset(8+depth)+"lowerptr_"+rel_name+"["+depthString+"] = "+upperPointer+";\n"+
        offset(8+depth)+"break;\n"+
        offset(7+depth)+"}\n"+
        offset(6+depth)+"}\n";

    /*
     * When we found an upper bound; to find the least upper bound;
     * use binary search to backtrack.
     */ 
    returnString += offset(6+depth)+"/* Backtrack with binary search */\n"+
        offset(6+depth)+"if (leap > 2 && max_"+attrName+" <= "+rel_name+
        "[lowerptr_"+rel_name+"["+depthString+"]]."+attrName+")\n"+offset(6+depth)+"{\n"+
        offset(7+depth)+"leap /= 2;\n"+
        offset(7+depth)+"size_t high = lowerptr_"+rel_name+"["+depthString+"], low = "+
        "lowerptr_"+rel_name+"["+depthString+"] - leap, mid = 0;\n"+
        offset(7+depth)+"while (high > low && high != low)\n"+offset(7+depth)+"{\n"+
        offset(8+depth)+"mid = (high + low) / 2;\n"+
        offset(8+depth)+"if (max_"+attrName+" > "+rel_name+"[mid - 1]."+attrName+" && "+
        "max_"+attrName+" <= "+rel_name+"[mid]."+attrName+")\n"+offset(8+depth)+"{\n"+
        offset(9+depth)+"lowerptr_"+rel_name+"["+depthString+"] = mid;\n"+
        offset(9+depth)+"break;\n"+offset(8+depth)+"}\n"+
        offset(8+depth)+"else if (max_"+attrName+" <= "+rel_name+"[mid]."+attrName+")\n"+
        offset(9+depth)+"high = mid - 1;\n"+
        offset(8+depth)+"else \n"+offset(9+depth)+"low = mid + 1;\n"+
        offset(7+depth)+"}\n"+
        offset(7+depth)+"mid = (high + low) / 2;\n"+
        offset(7+depth)+"if ("+rel_name+"[mid-1]."+attrName+" >= max_"+attrName+")\n"+
        offset(8+depth)+"mid -= 1;\n"+
        offset(7+depth)+"lowerptr_"+rel_name+"["+depthString+"] = mid;\n"+
        offset(6+depth)+"}\n";

    return returnString;
}